

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O1

void Abc_NtkCheckAbsorb(Abc_Ntk_t *pNtk,int nLutSize)

{
  int *piVar1;
  int iVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pPivot;
  void *pvVar3;
  int iVar4;
  int iVar5;
  void *__s;
  Vec_Ptr_t *vFanins;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  timespec ts;
  timespec local_40;
  
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  iVar4 = pNtk->vObjs->nSize;
  iVar5 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar5 = iVar4;
  }
  uVar11 = 0;
  if (iVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar5 << 2);
  }
  memset(__s,0,(long)iVar4 * 4);
  vFanins = (Vec_Ptr_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vFanins->pArray = ppvVar6;
  pVVar7 = pNtk->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar7->pArray[lVar10];
      if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
         (0 < (pObj->vFanins).nSize)) {
        lVar9 = 0;
        do {
          pPivot = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar9]];
          if (((*(uint *)&pPivot->field_0x14 & 0xf) == 7) &&
             (iVar5 = Abc_ObjCheckAbsorb(pObj,pPivot,nLutSize,vFanins), iVar5 != 0)) {
            iVar5 = pPivot->Id;
            if (((long)iVar5 < 0) || (iVar4 <= iVar5)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar1 = (int *)((long)__s + (long)iVar5 * 4);
            *piVar1 = *piVar1 + 1;
            uVar11 = uVar11 + 1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (pObj->vFanins).nSize);
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pNtk->vObjs;
    } while (lVar10 < pVVar7->nSize);
  }
  if (vFanins->pArray != (void **)0x0) {
    free(vFanins->pArray);
    vFanins->pArray = (void **)0x0;
  }
  free(vFanins);
  lVar10 = (long)pNtk->vObjs->nSize;
  if (lVar10 < 1) {
    iVar5 = 0;
  }
  else {
    lVar9 = 0;
    iVar5 = 0;
    do {
      pvVar3 = pNtk->vObjs->pArray[lVar9];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        iVar2 = *(int *)((long)pvVar3 + 0x10);
        if (((long)iVar2 < 0) || (iVar4 <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = iVar5 + (uint)(*(int *)((long)__s + (long)iVar2 * 4) ==
                              *(int *)((long)pvVar3 + 0x2c));
      }
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  printf("Absorted = %6d. (%6.2f %%)   Fully = %6d. (%6.2f %%)  ",
         ((double)(int)uVar11 * 100.0) / (double)pNtk->nObjCounts[7],
         ((double)iVar5 * 100.0) / (double)pNtk->nObjCounts[7],(ulong)uVar11);
  iVar5 = 3;
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar10 + lVar8) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkCheckAbsorb( Abc_Ntk_t * pNtk, int nLutSize )
{
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vFanins;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    vCounts = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vFanins = Vec_PtrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    Abc_ObjForEachFanin( pObj, pFanin, k )
        if ( Abc_ObjIsNode(pFanin) && Abc_ObjCheckAbsorb( pObj, pFanin, nLutSize, vFanins ) )
        {
            Vec_IntAddToEntry( vCounts, Abc_ObjId(pFanin), 1 );
            Counter++;
        }
    Vec_PtrFree( vFanins );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Vec_IntEntry(vCounts, Abc_ObjId(pObj)) == Abc_ObjFanoutNum(pObj) )
        {
//            printf( "%d ", Abc_ObjId(pObj) );
            Counter2++;
        }
    printf( "Absorted = %6d. (%6.2f %%)   Fully = %6d. (%6.2f %%)  ", 
        Counter,  100.0 * Counter  / Abc_NtkNodeNum(pNtk), 
        Counter2, 100.0 * Counter2 / Abc_NtkNodeNum(pNtk) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}